

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::exec_actions<timertt::details::thread_unsafe_manager_mixin::lock_guard>
          (timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this,lock_guard *lock,timer_type *head)

{
  ostringstream ss;
  
  if (head != (timer_type *)0x0) {
    do {
      if (*(int *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc == 2) {
        if ((head->m_action).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(head->m_action)._M_invoker)((_Any_data *)&head->m_action);
      }
      head = head->m_next;
    } while (head != (timer_type *)0x0);
  }
  return;
}

Assistant:

void
	exec_actions(
		//! Object lock.
		//! This lock will be unlocked before execution of actions
		//! and locked back after.
		UNIQUE_LOCK & lock,
		//! Head of execution list.
		//! Cannot be nullptr.
		timer_type * head )
	{
		lock.unlock();

		while( head )
		{
			try
			{
				// Status of timer can be changed. So it must be checked
				// just before execution. If timer is waiting for
				// deregistration it must not be executed.
				if( timer_status::wait_for_execution == head->m_status )
					head->m_action();
			}
			catch( const std::exception & x )
			{
				this->m_exception_handler( x );
			}
			catch( ... )
			{
				std::ostringstream ss;
				ss << __FILE__ << "(" << __LINE__ 
					<< "): an unknown exception from timer action";
				this->m_error_logger( ss.str() );
				std::abort();
			}

			head = head->m_next;
		}

		lock.lock();
	}